

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

string * __thiscall
CLI::Formatter::make_usage(string *__return_storage_ptr__,Formatter *this,App *app,string *name)

{
  pointer puVar1;
  pointer psVar2;
  ostream *poVar3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  pointer psVar5;
  __normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
  _Var6;
  size_t sVar7;
  string *delim;
  App **ppAVar8;
  char *pcVar9;
  Option_p *opt;
  pointer puVar10;
  pointer ppAVar11;
  bool bVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  positional_names;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> positionals;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groups;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> non_pos_options;
  string usage;
  stringstream out;
  undefined1 local_328 [16];
  undefined1 local_318 [31];
  allocator_type local_2f9;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> local_2f8;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> local_2e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c8;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> local_2b0;
  string local_298;
  undefined1 local_278 [32];
  string local_258;
  string local_238;
  string local_218;
  _Any_data local_1f8;
  code *local_1e8;
  code *local_1e0;
  _Any_data local_1d8;
  code *local_1c8;
  code *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  CLI::App::get_usage_abi_cxx11_(&local_218,app);
  if (local_218._M_string_length == 0) {
    ::std::__cxx11::stringstream::stringstream(local_1b8);
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"Usage","");
    FormatterBase::get_label((string *)local_328,&this->super_FormatterBase,&local_238);
    poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(char *)local_328._0_8_,local_328._8_8_);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
    bVar12 = name->_M_string_length != 0;
    pcVar9 = ",\t ";
    if (!bVar12) {
      pcVar9 = " \t";
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar9 + 2,(ulong)bVar12);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,(name->_M_dataplus)._M_p,name->_M_string_length);
    if ((undefined1 *)local_328._0_8_ != local_318) {
      operator_delete((void *)local_328._0_8_,(ulong)(local_318._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    local_2c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_2c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    puVar10 = (app->options_).
              super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (app->options_).
             super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar10 != puVar1) {
      do {
        _Var4 = ::std::
                __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          (local_2c8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           local_2c8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                           (puVar10->_M_t).
                           super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
                           _M_t.
                           super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                           super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
        if (_Var4._M_current ==
            local_2c8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_2c8,
                      (value_type *)
                      (puVar10->_M_t).
                      super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                      super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                      super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
        }
        puVar10 = puVar10 + 1;
      } while (puVar10 != puVar1);
    }
    local_1d8._M_unused._M_object = (void *)0x0;
    local_1d8._8_8_ = 0;
    local_1c0 = std::
                _Function_handler<bool_(const_CLI::Option_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/ThirdParty/helics/external/CLI11/CLI11.hpp:10868:26)>
                ::_M_invoke;
    local_1c8 = std::
                _Function_handler<bool_(const_CLI::Option_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/ThirdParty/helics/external/CLI11/CLI11.hpp:10868:26)>
                ::_M_manager;
    CLI::App::get_options(&local_2b0,app,(function<bool_(const_CLI::Option_*)> *)&local_1d8);
    if (local_1c8 != (code *)0x0) {
      (*local_1c8)(&local_1d8,&local_1d8,__destroy_functor);
    }
    if (local_2b0.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_2b0.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," [",2);
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"OPTIONS","");
      FormatterBase::get_label((string *)local_328,&this->super_FormatterBase,&local_258);
      poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(char *)local_328._0_8_,local_328._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]",1);
      if ((undefined1 *)local_328._0_8_ != local_318) {
        operator_delete((void *)local_328._0_8_,(ulong)(local_318._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
    }
    local_1f8._M_unused._M_object = (void *)0x0;
    local_1f8._8_8_ = 0;
    local_1e0 = std::
                _Function_handler<bool_(const_CLI::Option_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/ThirdParty/helics/external/CLI11/CLI11.hpp:10873:64)>
                ::_M_invoke;
    local_1e8 = std::
                _Function_handler<bool_(const_CLI::Option_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/ThirdParty/helics/external/CLI11/CLI11.hpp:10873:64)>
                ::_M_manager;
    CLI::App::get_options(&local_2e0,app,(function<bool_(const_CLI::Option_*)> *)&local_1f8);
    if (local_1e8 != (code *)0x0) {
      (*local_1e8)(&local_1f8,&local_1f8,__destroy_functor);
    }
    if (local_2e0.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_2e0.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_2f8,
               (long)local_2e0.
                     super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_2e0.
                     super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)local_328);
      delim = (string *)this;
      ::std::
      transform<__gnu_cxx::__normal_iterator<CLI::Option_const**,std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,CLI::Formatter::make_usage(CLI::App_const*,std::__cxx11::string)const::_lambda(CLI::Option_const*)_3_>
                ((__normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
                  )local_2e0.
                   super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
                  )local_2e0.
                   super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )local_2f8.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>
                   ._M_impl.super__Vector_impl_data._M_start,(anon_class_8_1_8991fb9c)this);
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
      local_278._0_8_ = (pointer)(local_278 + 0x10);
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_278," ","");
      detail::join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((string *)local_328,(detail *)&local_2f8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_278,delim);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,(char *)local_328._0_8_,local_328._8_8_);
      if ((undefined1 *)local_328._0_8_ != local_318) {
        operator_delete((void *)local_328._0_8_,(ulong)(local_318._0_8_ + 1));
      }
      if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
        operator_delete((void *)local_278._0_8_,
                        (ulong)((long)&((_Alloc_hider *)local_278._16_8_)->_M_p + 1));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_2f8);
    }
    local_328._0_8_ = (char *)0x0;
    local_328._8_8_ = 0;
    local_318._8_8_ =
         std::
         _Function_handler<bool_(const_CLI::App_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/ThirdParty/helics/external/CLI11/CLI11.hpp:10888:16)>
         ::_M_invoke;
    local_318._0_8_ =
         std::
         _Function_handler<bool_(const_CLI::App_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/ThirdParty/helics/external/CLI11/CLI11.hpp:10888:16)>
         ::_M_manager;
    std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::vector
              (&local_2f8,
               (long)(app->subcommands_).
                     super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(app->subcommands_).
                     super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4,&local_2f9);
    psVar2 = (app->subcommands_).
             super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    ppAVar8 = local_2f8.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    for (psVar5 = (app->subcommands_).
                  super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar5 != psVar2; psVar5 = psVar5 + 1)
    {
      *ppAVar8 = (psVar5->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      ppAVar8 = ppAVar8 + 1;
    }
    _Var6._M_current =
         local_2f8.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    ppAVar11 = local_2f8.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (((code *)local_318._0_8_ != (code *)0x0) &&
       (_Var6 = ::std::
                __remove_if<__gnu_cxx::__normal_iterator<CLI::App_const**,std::vector<CLI::App_const*,std::allocator<CLI::App_const*>>>,__gnu_cxx::__ops::_Iter_pred<CLI::App::get_subcommands(std::function<bool(CLI::App_const*)>const&)const::_lambda(CLI::App_const*)_1_>>
                          ((__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                            )local_2f8.
                             super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                           (__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                            )local_2f8.
                             super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                           (_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_ThirdParty_helics_external_CLI11_CLI11_hpp:8510:39)>
                            )local_328),
       ppAVar11 = local_2f8.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                  _M_impl.super__Vector_impl_data._M_start,
       _Var6._M_current !=
       local_2f8.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
       super__Vector_impl_data._M_finish)) {
      local_2f8.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)_Var6;
    }
    if (ppAVar11 != (App **)0x0) {
      operator_delete(ppAVar11,(long)local_2f8.
                                     super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)ppAVar11);
    }
    if ((code *)local_318._0_8_ != (code *)0x0) {
      (*(code *)local_318._0_8_)(local_328,local_328,3);
    }
    if (ppAVar11 != _Var6._M_current) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
      bVar12 = app->require_subcommand_min_ == 0;
      pcVar9 = "[";
      if (!bVar12) {
        pcVar9 = "";
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar9,(ulong)bVar12);
      if (app->require_subcommand_max_ < 2) {
        pcVar9 = "SUBCOMMAND";
      }
      else {
        pcVar9 = "SUBCOMMANDS";
        if (1 < app->require_subcommand_min_) {
          pcVar9 = "SUBCOMMAND";
        }
      }
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      sVar7 = strlen(pcVar9);
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,pcVar9,pcVar9 + sVar7);
      FormatterBase::get_label((string *)local_328,&this->super_FormatterBase,&local_298);
      poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(char *)local_328._0_8_,local_328._8_8_);
      bVar12 = app->require_subcommand_min_ == 0;
      pcVar9 = "";
      if (bVar12) {
        pcVar9 = "]";
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar9,(ulong)bVar12);
      if ((undefined1 *)local_328._0_8_ != local_318) {
        operator_delete((void *)local_328._0_8_,(ulong)(local_318._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
    }
    local_328[0] = 10;
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_328,1);
    ::std::__cxx11::stringbuf::str();
    if (local_2e0.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (Option **)0x0) {
      operator_delete(local_2e0.
                      super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_2e0.
                            super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2e0.
                            super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_2b0.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2b0.
                      super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_2b0.
                            super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2b0.
                            super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2c8);
    ::std::__cxx11::stringstream::~stringstream(local_1b8);
    ::std::ios_base::~ios_base(local_138);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_218._M_dataplus._M_p,
               local_218._M_dataplus._M_p + local_218._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"\n");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string Formatter::make_usage(const App *app, std::string name) const {
    std::string usage = app->get_usage();
    if(!usage.empty()) {
        return usage + "\n";
    }

    std::stringstream out;

    out << get_label("Usage") << ":" << (name.empty() ? "" : " ") << name;

    std::vector<std::string> groups = app->get_groups();

    // Print an Options badge if any options exist
    std::vector<const Option *> non_pos_options =
        app->get_options([](const Option *opt) { return opt->nonpositional(); });
    if(!non_pos_options.empty())
        out << " [" << get_label("OPTIONS") << "]";

    // Positionals need to be listed here
    std::vector<const Option *> positionals = app->get_options([](const Option *opt) { return opt->get_positional(); });

    // Print out positionals if any are left
    if(!positionals.empty()) {
        // Convert to help names
        std::vector<std::string> positional_names(positionals.size());
        std::transform(positionals.begin(), positionals.end(), positional_names.begin(), [this](const Option *opt) {
            return make_option_usage(opt);
        });

        out << " " << detail::join(positional_names, " ");
    }

    // Add a marker if subcommands are expected or optional
    if(!app->get_subcommands(
               [](const CLI::App *subc) { return ((!subc->get_disabled()) && (!subc->get_name().empty())); })
            .empty()) {
        out << " " << (app->get_require_subcommand_min() == 0 ? "[" : "")
            << get_label(app->get_require_subcommand_max() < 2 || app->get_require_subcommand_min() > 1 ? "SUBCOMMAND"
                                                                                                        : "SUBCOMMANDS")
            << (app->get_require_subcommand_min() == 0 ? "]" : "");
    }

    out << '\n';

    return out.str();
}